

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void iCopyColors<cRGBT,cBGRA,bCopy>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  BYTE BVar1;
  byte bVar2;
  byte bVar3;
  undefined2 uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  FSpecialColormap *pFVar9;
  BYTE BVar10;
  BYTE *pBVar11;
  byte *pbVar12;
  long lVar13;
  EBlend EVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  
  pFVar9 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
    EVar14 = BLEND_NONE;
  }
  else {
    EVar14 = inf->blend;
  }
  switch(EVar14) {
  case BLEND_NONE:
    if (0 < count) {
      pBVar11 = pin + 2;
      lVar13 = 0;
      do {
        BVar10 = 0xff;
        if ((pBVar11[-2] == tr) && (pBVar11[-1] == tg)) {
          BVar10 = -(*pBVar11 != tb);
        }
        if (BVar10 != '\0') {
          pout[lVar13 * 4 + 2] = pBVar11[-2];
          pout[lVar13 * 4 + 1] = pBVar11[-1];
          pout[lVar13 * 4] = *pBVar11;
          pout[lVar13 * 4 + 3] = BVar10;
        }
        lVar13 = lVar13 + 1;
        pBVar11 = pBVar11 + step;
      } while (count != (int)lVar13);
    }
    break;
  case BLEND_ICEMAP:
    if (0 < count) {
      pbVar12 = pin + 2;
      lVar13 = 0;
      do {
        BVar10 = 0xff;
        if ((pbVar12[-2] == tr) && (pbVar12[-1] == tg)) {
          BVar10 = -(*pbVar12 != tb);
        }
        if (BVar10 != '\0') {
          uVar18 = (uint)pbVar12[-1] * 0x8f + (uint)pbVar12[-2] * 0x4d +
                   ((uint)*pbVar12 + (uint)*pbVar12 * 8) * 4 >> 0xc;
          BVar1 = IcePalette[uVar18][1];
          pout[lVar13 * 4 + 2] = IcePalette[uVar18][0];
          pout[lVar13 * 4 + 1] = BVar1;
          pout[lVar13 * 4] = IcePalette[uVar18][2];
          pout[lVar13 * 4 + 3] = BVar10;
        }
        lVar13 = lVar13 + 1;
        pbVar12 = pbVar12 + step;
      } while (count != (int)lVar13);
    }
    break;
  case BLEND_OVERLAY:
    if (0 < count) {
      pbVar12 = pin + 2;
      lVar13 = 0;
      do {
        BVar10 = 0xff;
        if ((pbVar12[-2] == tr) && (pbVar12[-1] == tg)) {
          BVar10 = -(*pbVar12 != tb);
        }
        if (BVar10 != '\0') {
          iVar15 = inf->blendcolor[3];
          bVar2 = pbVar12[-1];
          iVar16 = inf->blendcolor[1];
          bVar3 = *pbVar12;
          iVar5 = inf->blendcolor[2];
          pout[lVar13 * 4 + 2] = (BYTE)((uint)pbVar12[-2] * iVar15 + inf->blendcolor[0] >> 0x10);
          pout[lVar13 * 4 + 1] = (BYTE)((uint)bVar2 * iVar15 + iVar16 >> 0x10);
          pout[lVar13 * 4] = (BYTE)((uint)bVar3 * iVar15 + iVar5 >> 0x10);
          pout[lVar13 * 4 + 3] = BVar10;
        }
        lVar13 = lVar13 + 1;
        pbVar12 = pbVar12 + step;
      } while (count != (int)lVar13);
    }
    break;
  case BLEND_MODULATE:
    if (0 < count) {
      pbVar12 = pin + 2;
      lVar13 = 0;
      do {
        BVar10 = 0xff;
        if ((pbVar12[-2] == tr) && (pbVar12[-1] == tg)) {
          BVar10 = -(*pbVar12 != tb);
        }
        if (BVar10 != '\0') {
          bVar2 = pbVar12[-1];
          iVar15 = inf->blendcolor[1];
          bVar3 = *pbVar12;
          iVar16 = inf->blendcolor[2];
          pout[lVar13 * 4 + 2] = (BYTE)((uint)pbVar12[-2] * inf->blendcolor[0] >> 0x10);
          pout[lVar13 * 4 + 1] = (BYTE)((uint)bVar2 * iVar15 >> 0x10);
          pout[lVar13 * 4] = (BYTE)((uint)bVar3 * iVar16 >> 0x10);
          pout[lVar13 * 4 + 3] = BVar10;
        }
        lVar13 = lVar13 + 1;
        pbVar12 = pbVar12 + step;
      } while (count != (int)lVar13);
    }
    break;
  default:
    EVar14 = inf->blend;
    lVar13 = (long)EVar14;
    if (lVar13 < 0x21) {
      if ((BLEND_ICEMAP < EVar14) && (0 < count)) {
        iVar15 = 0x20 - EVar14;
        pbVar12 = pin + 2;
        lVar13 = 0;
        do {
          bVar2 = pbVar12[-2];
          BVar10 = 0xff;
          if ((bVar2 == tr) && (pbVar12[-1] == tg)) {
            BVar10 = -(*pbVar12 != tb);
          }
          if (BVar10 != '\0') {
            bVar3 = *pbVar12;
            iVar16 = ((uint)pbVar12[-1] * 0x8f + (uint)bVar2 * 0x4d +
                      ((uint)bVar3 + (uint)bVar3 * 8) * 4 >> 8) * (EVar14 + BLEND_MODULATE);
            lVar19 = (long)(int)((uint)bVar2 * iVar15 + iVar16) * 0x84210843;
            lVar7 = (long)(int)((uint)pbVar12[-1] * iVar15 + iVar16) * 0x84210843;
            lVar8 = (long)(int)((uint)bVar3 * iVar15 + iVar16) * 0x84210843;
            pout[lVar13 * 4 + 2] = (char)(uint)((ulong)lVar19 >> 0x24) - (char)(lVar19 >> 0x3f);
            pout[lVar13 * 4 + 1] = (char)(uint)((ulong)lVar7 >> 0x24) - (char)(lVar7 >> 0x3f);
            pout[lVar13 * 4] = (char)(uint)((ulong)lVar8 >> 0x24) - (char)(lVar8 >> 0x3f);
            pout[lVar13 * 4 + 3] = BVar10;
          }
          lVar13 = lVar13 + 1;
          pbVar12 = pbVar12 + step;
        } while (count != (int)lVar13);
      }
    }
    else if (0 < count) {
      pbVar12 = pin + 2;
      lVar19 = 0;
      do {
        BVar10 = 0xff;
        if ((pbVar12[-2] == tr) && (pbVar12[-1] == tg)) {
          BVar10 = -(*pbVar12 != tb);
        }
        if (BVar10 != '\0') {
          uVar18 = (uint)pbVar12[-1] * 0x8f + (uint)pbVar12[-2] * 0x4d +
                   ((uint)*pbVar12 + (uint)*pbVar12 * 8) * 4;
          uVar6 = uVar18 >> 8;
          uVar17 = (ulong)uVar6;
          if (0xfe < uVar6) {
            uVar17 = 0xff;
          }
          if (uVar18 < 0x100) {
            uVar17 = 0;
          }
          uVar4 = *(undefined2 *)((long)pFVar9 + uVar17 * 4 + lVar13 * 0x518 + -0xa700);
          pout[lVar19 * 4 + 2] = *(BYTE *)((long)pFVar9 + uVar17 * 4 + lVar13 * 0x518 + -0xa6fe);
          *(undefined2 *)(pout + lVar19 * 4) = uVar4;
          pout[lVar19 * 4 + 3] = BVar10;
        }
        lVar19 = lVar19 + 1;
        pbVar12 = pbVar12 + step;
      } while (count != (int)lVar19);
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}